

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::peer_connection::can_disconnect(peer_connection *this,error_code *ec)

{
  bool bVar1;
  uint uVar2;
  __shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar3;
  shared_ptr<libtorrent::peer_plugin> *e;
  const_iterator __end2;
  const_iterator __begin2;
  list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
  *__range2;
  error_code *ec_local;
  peer_connection *this_local;
  
  __end2 = ::std::__cxx11::
           list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
           ::begin(&this->m_extensions);
  e = (shared_ptr<libtorrent::peer_plugin> *)
      ::std::__cxx11::
      list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
      ::end(&this->m_extensions);
  while( true ) {
    bVar1 = ::std::operator!=(&__end2,(_Self *)&e);
    if (!bVar1) {
      return true;
    }
    this_00 = (__shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)::std::_List_const_iterator<std::shared_ptr<libtorrent::peer_plugin>_>::operator*
                           (&__end2);
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    uVar2 = (*peVar3->_vptr_peer_plugin[0x25])(peVar3,ec);
    if ((uVar2 & 1) == 0) break;
    ::std::_List_const_iterator<std::shared_ptr<libtorrent::peer_plugin>_>::operator++(&__end2);
  }
  return false;
}

Assistant:

bool peer_connection::can_disconnect(error_code const& ec) const
	{
		TORRENT_ASSERT(is_single_thread());
#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			if (!e->can_disconnect(ec)) return false;
		}
#else
		TORRENT_UNUSED(ec);
#endif
		return true;
	}